

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O1

void Bmc_CexCarePropagateFwd(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vPriosIn,Vec_Int_t *vPriosFf)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  
  iVar7 = (pCex->iFrame + 1) * pCex->nPis;
  if (iVar7 < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar10 = iVar7 * 2;
  pGVar4 = p->pObjs;
  pGVar4->Value = uVar10;
  lVar11 = (long)p->nRegs;
  if (0 < lVar11) {
    pVVar5 = p->vCos;
    iVar7 = pVVar5->nSize;
    uVar13 = (ulong)(uint)(iVar7 - p->nRegs);
    do {
      if (((int)uVar13 < 0) || (iVar7 <= (int)uVar13)) {
LAB_0057247f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = pVVar5->pArray[uVar13];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_00572460:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar4[iVar8].Value = uVar10;
      uVar13 = uVar13 + 1;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  vPriosFf->nSize = 0;
  if (-1 < pCex->iFrame) {
    iVar7 = 0;
    do {
      iVar8 = p->nRegs;
      if (0 < iVar8) {
        iVar12 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar10 = (iVar1 - iVar8) + iVar12;
          if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) goto LAB_0057247f;
          iVar1 = p->vCos->pArray[uVar10];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00572460;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar10 = (iVar2 - iVar8) + iVar12;
          if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) goto LAB_0057247f;
          iVar8 = p->vCis->pArray[uVar10];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00572460;
          uVar10 = pGVar4[iVar1].Value;
          pGVar4[iVar8].Value = uVar10;
          uVar3 = vPriosFf->nCap;
          if (vPriosFf->nSize == uVar3) {
            if ((int)uVar3 < 0x10) {
              if (vPriosFf->pArray == (int *)0x0) {
                piVar9 = (int *)malloc(0x40);
              }
              else {
                piVar9 = (int *)realloc(vPriosFf->pArray,0x40);
              }
              vPriosFf->pArray = piVar9;
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar3 * 2;
              if (iVar8 <= (int)uVar3) goto LAB_00572407;
              if (vPriosFf->pArray == (int *)0x0) {
                piVar9 = (int *)malloc((ulong)uVar3 << 3);
              }
              else {
                piVar9 = (int *)realloc(vPriosFf->pArray,(ulong)uVar3 << 3);
              }
              vPriosFf->pArray = piVar9;
            }
            if (piVar9 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            vPriosFf->nCap = iVar8;
          }
LAB_00572407:
          iVar8 = vPriosFf->nSize;
          vPriosFf->nSize = iVar8 + 1;
          vPriosFf->pArray[iVar8] = uVar10;
          iVar12 = iVar12 + 1;
          iVar8 = p->nRegs;
        } while (iVar12 < iVar8);
      }
      Bmc_CexCarePropagateFwdOne(p,pCex,iVar7,vPriosIn);
      bVar6 = iVar7 < pCex->iFrame;
      iVar7 = iVar7 + 1;
    } while (bVar6);
  }
  return;
}

Assistant:

void Bmc_CexCarePropagateFwd( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vPriosIn, Vec_Int_t * vPriosFf )
{
    Gia_Obj_t * pObjRo, * pObjRi;
    int i, f, ValueMax = Abc_Var2Lit( pCex->nPis * (pCex->iFrame + 1), 0 );
    Gia_ManConst0( p )->Value = ValueMax;
    Gia_ManForEachRi( p, pObjRi, i )
        pObjRi->Value = ValueMax;
    Vec_IntClear( vPriosFf );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            Vec_IntPush( vPriosFf, (pObjRo->Value = pObjRi->Value) );
        Bmc_CexCarePropagateFwdOne( p, pCex, f, vPriosIn );
    }
}